

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

void * unqlite_context_realloc_chunk(unqlite_context *pCtx,void *pChunk,uint nByte)

{
  void *pvVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  
  pvVar2 = SyMemBackendRealloc(&pCtx->pVm->sAllocator,pChunk,nByte);
  if ((pvVar2 != (void *)0x0) && (uVar3 = (ulong)(pCtx->sChunk).nUsed, uVar3 != 0)) {
    pvVar1 = (pCtx->sChunk).pBase;
    uVar4 = 0;
    do {
      if (*(void **)((long)pvVar1 + uVar4 * 8) == pChunk) {
        *(void **)((long)pvVar1 + uVar4 * 8) = pvVar2;
        return pvVar2;
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return pvVar2;
}

Assistant:

void * unqlite_context_realloc_chunk(unqlite_context *pCtx,void *pChunk,unsigned int nByte)
{
	return jx9_context_realloc_chunk(pCtx,pChunk,nByte);
}